

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  uint uVar5;
  Limit LVar6;
  string *value;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  uint8 *puVar7;
  FieldDescriptorProto *pFVar8;
  MessageOptions *this_03;
  uint32 tag;
  int iVar9;
  uint32 local_64;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  UnknownFieldSet *local_38;
  
  local_60 = &(this->field_).super_RepeatedPtrFieldBase;
  local_58 = &(this->nested_type_).super_RepeatedPtrFieldBase;
  local_50 = &(this->enum_type_).super_RepeatedPtrFieldBase;
  local_48 = &(this->extension_range_).super_RepeatedPtrFieldBase;
  local_40 = &(this->extension_).super_RepeatedPtrFieldBase;
  local_38 = &this->_unknown_fields_;
LAB_001e6999:
  do {
    puVar7 = input->buffer_;
    if ((puVar7 < input->buffer_end_) && (tag = (uint32)(char)*puVar7, -1 < (char)*puVar7)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar7 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar5 = tag & 7;
    switch(tag >> 3) {
    case 1:
      if (uVar5 == 2) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        value = this->name_;
        if (value == (string *)internal::kEmptyString_abi_cxx11_) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          this->name_ = value;
        }
        bVar4 = internal::WireFormatLite::ReadString(input,value);
        if (!bVar4) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (*puVar7 == '\x12')) {
          do {
            input->buffer_ = puVar7 + 1;
LAB_001e6aca:
            iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
            iVar9 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
            if (iVar2 < iVar9) {
              ppvVar3 = (this->field_).super_RepeatedPtrFieldBase.elements_;
              (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              pFVar8 = (FieldDescriptorProto *)ppvVar3[iVar2];
            }
            else {
              if (iVar9 == (this->field_).super_RepeatedPtrFieldBase.total_size_) {
                internal::RepeatedPtrFieldBase::Reserve(local_60,iVar9 + 1);
                iVar9 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
              }
              (this->field_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
              pFVar8 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
              ppvVar3 = (this->field_).super_RepeatedPtrFieldBase.elements_;
              iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
              (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              ppvVar3[iVar2] = pFVar8;
            }
            puVar7 = input->buffer_;
            if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
              input->buffer_ = puVar7 + 1;
              local_64 = (int)(char)uVar1;
            }
            else {
              bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
              if (!bVar4) {
                return false;
              }
            }
            iVar2 = input->recursion_depth_;
            input->recursion_depth_ = iVar2 + 1;
            if (input->recursion_limit_ <= iVar2) {
              return false;
            }
            LVar6 = io::CodedInputStream::PushLimit(input,local_64);
            bVar4 = FieldDescriptorProto::MergePartialFromCodedStream(pFVar8,input);
            if (!bVar4) {
              return false;
            }
            if (input->legitimate_message_end_ != true) {
              return false;
            }
            io::CodedInputStream::PopLimit(input,LVar6);
            if (0 < input->recursion_depth_) {
              input->recursion_depth_ = input->recursion_depth_ + -1;
            }
            puVar7 = input->buffer_;
            if (input->buffer_end_ <= puVar7) goto LAB_001e6999;
          } while (*puVar7 == '\x12');
          if (*puVar7 == '\x1a') {
            do {
              input->buffer_ = puVar7 + 1;
LAB_001e6bcb:
              iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
              iVar9 = (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
              if (iVar2 < iVar9) {
                ppvVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
                (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                this_00 = (DescriptorProto *)ppvVar3[iVar2];
              }
              else {
                if (iVar9 == (this->nested_type_).super_RepeatedPtrFieldBase.total_size_) {
                  internal::RepeatedPtrFieldBase::Reserve(local_58,iVar9 + 1);
                  iVar9 = (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
                }
                (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
                this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
                ppvVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
                iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
                (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                ppvVar3[iVar2] = this_00;
              }
              puVar7 = input->buffer_;
              if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
                input->buffer_ = puVar7 + 1;
                local_64 = (int)(char)uVar1;
              }
              else {
                bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                if (!bVar4) {
                  return false;
                }
              }
              iVar2 = input->recursion_depth_;
              input->recursion_depth_ = iVar2 + 1;
              if (input->recursion_limit_ <= iVar2) {
                return false;
              }
              LVar6 = io::CodedInputStream::PushLimit(input,local_64);
              bVar4 = MergePartialFromCodedStream(this_00,input);
              if (!bVar4) {
                return false;
              }
              if (input->legitimate_message_end_ != true) {
                return false;
              }
              io::CodedInputStream::PopLimit(input,LVar6);
              if (0 < input->recursion_depth_) {
                input->recursion_depth_ = input->recursion_depth_ + -1;
              }
              puVar7 = input->buffer_;
              if (input->buffer_end_ <= puVar7) goto LAB_001e6999;
            } while (*puVar7 == '\x1a');
            if (*puVar7 == '\"') {
              do {
                input->buffer_ = puVar7 + 1;
LAB_001e6ccc:
                iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                iVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                if (iVar2 < iVar9) {
                  ppvVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                  this_01 = (EnumDescriptorProto *)ppvVar3[iVar2];
                }
                else {
                  if (iVar9 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
                    internal::RepeatedPtrFieldBase::Reserve(local_50,iVar9 + 1);
                    iVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
                  }
                  (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
                  this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New
                                      ();
                  ppvVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
                  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
                  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                  ppvVar3[iVar2] = this_01;
                }
                puVar7 = input->buffer_;
                if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
                  input->buffer_ = puVar7 + 1;
                  local_64 = (int)(char)uVar1;
                }
                else {
                  bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                  if (!bVar4) {
                    return false;
                  }
                }
                iVar2 = input->recursion_depth_;
                input->recursion_depth_ = iVar2 + 1;
                if (input->recursion_limit_ <= iVar2) {
                  return false;
                }
                LVar6 = io::CodedInputStream::PushLimit(input,local_64);
                bVar4 = EnumDescriptorProto::MergePartialFromCodedStream(this_01,input);
                if (!bVar4) {
                  return false;
                }
                if (input->legitimate_message_end_ != true) {
                  return false;
                }
                io::CodedInputStream::PopLimit(input,LVar6);
                if (0 < input->recursion_depth_) {
                  input->recursion_depth_ = input->recursion_depth_ + -1;
                }
                puVar7 = input->buffer_;
                if (input->buffer_end_ <= puVar7) goto LAB_001e6999;
              } while (*puVar7 == '\"');
              if (*puVar7 == '*') {
                do {
                  input->buffer_ = puVar7 + 1;
LAB_001e6dcd:
                  iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
                  iVar9 = (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
                  if (iVar2 < iVar9) {
                    ppvVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
                    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                    this_02 = (DescriptorProto_ExtensionRange *)ppvVar3[iVar2];
                  }
                  else {
                    if (iVar9 == (this->extension_range_).super_RepeatedPtrFieldBase.total_size_) {
                      internal::RepeatedPtrFieldBase::Reserve(local_48,iVar9 + 1);
                      iVar9 = (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
                    }
                    (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
                    this_02 = internal::
                              GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>::
                              New();
                    ppvVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
                    iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
                    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                    ppvVar3[iVar2] = this_02;
                  }
                  puVar7 = input->buffer_;
                  if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
                    input->buffer_ = puVar7 + 1;
                    local_64 = (int)(char)uVar1;
                  }
                  else {
                    bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                    if (!bVar4) {
                      return false;
                    }
                  }
                  iVar2 = input->recursion_depth_;
                  input->recursion_depth_ = iVar2 + 1;
                  if (input->recursion_limit_ <= iVar2) {
                    return false;
                  }
                  LVar6 = io::CodedInputStream::PushLimit(input,local_64);
                  bVar4 = DescriptorProto_ExtensionRange::MergePartialFromCodedStream(this_02,input)
                  ;
                  if (!bVar4) {
                    return false;
                  }
                  if (input->legitimate_message_end_ != true) {
                    return false;
                  }
                  io::CodedInputStream::PopLimit(input,LVar6);
                  if (0 < input->recursion_depth_) {
                    input->recursion_depth_ = input->recursion_depth_ + -1;
                  }
                  puVar7 = input->buffer_;
                  if (input->buffer_end_ <= puVar7) goto LAB_001e6999;
                } while (*puVar7 == '*');
                if (*puVar7 == '2') {
                  do {
                    input->buffer_ = puVar7 + 1;
LAB_001e6ee6:
                    iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                    iVar9 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                    if (iVar2 < iVar9) {
                      ppvVar3 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                      (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                      pFVar8 = (FieldDescriptorProto *)ppvVar3[iVar2];
                    }
                    else {
                      if (iVar9 == (this->extension_).super_RepeatedPtrFieldBase.total_size_) {
                        internal::RepeatedPtrFieldBase::Reserve(local_40,iVar9 + 1);
                        iVar9 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
                      }
                      (this->extension_).super_RepeatedPtrFieldBase.allocated_size_ = iVar9 + 1;
                      pFVar8 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>
                               ::New();
                      ppvVar3 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
                      iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
                      (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                      ppvVar3[iVar2] = pFVar8;
                    }
                    puVar7 = input->buffer_;
                    if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
                      input->buffer_ = puVar7 + 1;
                      local_64 = (int)(char)uVar1;
                    }
                    else {
                      bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                      if (!bVar4) {
                        return false;
                      }
                    }
                    iVar2 = input->recursion_depth_;
                    input->recursion_depth_ = iVar2 + 1;
                    if (input->recursion_limit_ <= iVar2) {
                      return false;
                    }
                    LVar6 = io::CodedInputStream::PushLimit(input,local_64);
                    bVar4 = FieldDescriptorProto::MergePartialFromCodedStream(pFVar8,input);
                    if (!bVar4) {
                      return false;
                    }
                    if (input->legitimate_message_end_ != true) {
                      return false;
                    }
                    io::CodedInputStream::PopLimit(input,LVar6);
                    if (0 < input->recursion_depth_) {
                      input->recursion_depth_ = input->recursion_depth_ + -1;
                    }
                    puVar7 = input->buffer_;
                    if (input->buffer_end_ <= puVar7) goto LAB_001e6999;
                  } while (*puVar7 == '2');
                  if (*puVar7 == ':') {
                    input->buffer_ = puVar7 + 1;
LAB_001e6fe7:
                    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
                    this_03 = this->options_;
                    if (this_03 == (MessageOptions *)0x0) {
                      this_03 = (MessageOptions *)operator_new(0x68);
                      MessageOptions::MessageOptions(this_03);
                      this->options_ = this_03;
                    }
                    puVar7 = input->buffer_;
                    if ((puVar7 < input->buffer_end_) && (uVar1 = *puVar7, -1 < (char)uVar1)) {
                      input->buffer_ = puVar7 + 1;
                      local_64 = (int)(char)uVar1;
                    }
                    else {
                      bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_64);
                      if (!bVar4) {
                        return false;
                      }
                    }
                    iVar2 = input->recursion_depth_;
                    input->recursion_depth_ = iVar2 + 1;
                    if (input->recursion_limit_ <= iVar2) {
                      return false;
                    }
                    LVar6 = io::CodedInputStream::PushLimit(input,local_64);
                    bVar4 = MessageOptions::MergePartialFromCodedStream(this_03,input);
                    if (!bVar4) {
                      return false;
                    }
                    if (input->legitimate_message_end_ != true) {
                      return false;
                    }
                    io::CodedInputStream::PopLimit(input,LVar6);
                    if (0 < input->recursion_depth_) {
                      input->recursion_depth_ = input->recursion_depth_ + -1;
                    }
                    if ((input->buffer_ == input->buffer_end_) &&
                       ((input->buffer_size_after_limit_ != 0 ||
                        (input->total_bytes_read_ == input->current_limit_)))) {
                      input->last_tag_ = 0;
                      input->legitimate_message_end_ = true;
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001e6999;
      }
      break;
    case 2:
      if (uVar5 == 2) goto LAB_001e6aca;
      break;
    case 3:
      if (uVar5 == 2) goto LAB_001e6bcb;
      break;
    case 4:
      if (uVar5 == 2) goto LAB_001e6ccc;
      break;
    case 5:
      if (uVar5 == 2) goto LAB_001e6dcd;
      break;
    case 6:
      if (uVar5 == 2) goto LAB_001e6ee6;
      break;
    case 7:
      if (uVar5 == 2) goto LAB_001e6fe7;
    }
    if (uVar5 == 4) {
      return true;
    }
    bVar4 = internal::WireFormat::SkipField(input,tag,local_38);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_field:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        if (input->ExpectTag(26)) goto parse_nested_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_nested_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_nested_type;
        if (input->ExpectTag(34)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_enum_type;
        if (input->ExpectTag(42)) goto parse_extension_range;
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension_range:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_extension_range;
        if (input->ExpectTag(50)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_extension;
        if (input->ExpectTag(58)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}